

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::BufferCopyToBuffer::prepare
          (BufferCopyToBuffer *this,PrepareContext *context)

{
  RefData<vk::Handle<(vk::HandleType)8>_> data;
  RefData<vk::Handle<(vk::HandleType)7>_> data_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *device_00;
  VkDevice physicalDevice_00;
  VkPhysicalDevice vkd_00;
  DeviceInterface *vki_00;
  Context *pCVar1;
  VkDeviceSize VVar2;
  Handle<(vk::HandleType)8> *pHVar3;
  Move<vk::Handle<(vk::HandleType)7>_> local_e8;
  RefData<vk::Handle<(vk::HandleType)7>_> local_c8;
  Move<vk::Handle<(vk::HandleType)8>_> local_98;
  RefData<vk::Handle<(vk::HandleType)8>_> local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *queueFamilies;
  VkDevice device;
  VkPhysicalDevice physicalDevice;
  DeviceInterface *vkd;
  InstanceInterface *vki;
  PrepareContext *context_local;
  BufferCopyToBuffer *this_local;
  
  vki = (InstanceInterface *)context;
  context_local = (PrepareContext *)this;
  pCVar1 = PrepareContext::getContext(context);
  vkd = (DeviceInterface *)Context::getInstanceInterface(pCVar1);
  pCVar1 = PrepareContext::getContext((PrepareContext *)vki);
  physicalDevice = (VkPhysicalDevice)Context::getDeviceInterface(pCVar1);
  pCVar1 = PrepareContext::getContext((PrepareContext *)vki);
  device = (VkDevice)Context::getPhysicalDevice(pCVar1);
  pCVar1 = PrepareContext::getContext((PrepareContext *)vki);
  queueFamilies = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)Context::getDevice(pCVar1);
  pCVar1 = PrepareContext::getContext((PrepareContext *)vki);
  Context::getQueueFamilies(&local_58,pCVar1);
  local_40 = &local_58;
  VVar2 = PrepareContext::getBufferSize((PrepareContext *)vki);
  this->m_bufferSize = VVar2;
  createBuffer(&local_98,(DeviceInterface *)physicalDevice,(VkDevice)queueFamilies,
               this->m_bufferSize,2,VK_SHARING_MODE_EXCLUSIVE,local_40);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_78,(Move *)&local_98);
  data.deleter.m_deviceIface = local_78.deleter.m_deviceIface;
  data.object.m_internal = local_78.object.m_internal;
  data.deleter.m_device = local_78.deleter.m_device;
  data.deleter.m_allocator = local_78.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=(&this->m_dstBuffer,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_98);
  vki_00 = vkd;
  vkd_00 = physicalDevice;
  physicalDevice_00 = device;
  device_00 = queueFamilies;
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&(this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  bindBufferMemory(&local_e8,(InstanceInterface *)vki_00,(DeviceInterface *)vkd_00,
                   (VkPhysicalDevice)physicalDevice_00,(VkDevice)device_00,
                   (VkBuffer)pHVar3->m_internal,2);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_c8,(Move *)&local_e8);
  data_00.deleter.m_deviceIface = local_c8.deleter.m_deviceIface;
  data_00.object.m_internal = local_c8.object.m_internal;
  data_00.deleter.m_device = local_c8.deleter.m_device;
  data_00.deleter.m_allocator = local_c8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>_>::operator=(&this->m_memory,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>_>::~Move(&local_e8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_58);
  return;
}

Assistant:

void BufferCopyToBuffer::prepare (PrepareContext& context)
{
	const vk::InstanceInterface&	vki				= context.getContext().getInstanceInterface();
	const vk::DeviceInterface&		vkd				= context.getContext().getDeviceInterface();
	const vk::VkPhysicalDevice		physicalDevice	= context.getContext().getPhysicalDevice();
	const vk::VkDevice				device			= context.getContext().getDevice();
	const vector<deUint32>&			queueFamilies	= context.getContext().getQueueFamilies();

	m_bufferSize = context.getBufferSize();

	m_dstBuffer	= createBuffer(vkd, device, m_bufferSize, vk::VK_BUFFER_USAGE_TRANSFER_DST_BIT, vk::VK_SHARING_MODE_EXCLUSIVE, queueFamilies);
	m_memory	= bindBufferMemory(vki, vkd, physicalDevice, device, *m_dstBuffer, vk::VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT);
}